

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_symbols.h
# Opt level: O2

PlusSignMatcher * __thiscall
icu_63::numparse::impl::PlusSignMatcher::operator=(PlusSignMatcher *this,PlusSignMatcher *param_1)

{
  SymbolMatcher::operator=(&this->super_SymbolMatcher,&param_1->super_SymbolMatcher);
  this->fAllowTrailing = param_1->fAllowTrailing;
  return this;
}

Assistant:

class U_I18N_API PlusSignMatcher : public SymbolMatcher {
  public:
    PlusSignMatcher() = default;  // WARNING: Leaves the object in an unusable state

    PlusSignMatcher(const DecimalFormatSymbols& dfs, bool allowTrailing);

  protected:
    bool isDisabled(const ParsedNumber& result) const override;

    void accept(StringSegment& segment, ParsedNumber& result) const override;

  private:
    bool fAllowTrailing;
}